

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int skip_inter_mode(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int64_t *ref_frame_rd,int midx,
                   InterModeSFArgs *args,int is_low_temp_var)

{
  byte bVar1;
  BLOCK_SIZE bsize_00;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  int iVar5;
  MACROBLOCKD *xd_00;
  int64_t *in_RCX;
  byte in_DL;
  AV1_COMP *in_RSI;
  AV1_COMP *in_RDI;
  int in_R8D;
  undefined8 *in_R9;
  MACROBLOCK *unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  int subgop_size;
  int8_t ref_frame_type;
  int64_t mode_threshold;
  int mul_fact;
  int ret;
  FRAME_UPDATE_TYPE update_type;
  int comp_pred;
  MV_REFERENCE_FRAME second_ref_frame;
  MV_REFERENCE_FRAME ref_frame;
  MV_REFERENCE_FRAME *ref_frames;
  PREDICTION_MODE this_mode;
  MODE_DEFINITION *mode_def;
  THR_MODES mode_enum;
  MACROBLOCKD *xd;
  SPEED_FEATURES *sf;
  MV_REFERENCE_FRAME *rf;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  PREDICTION_MODE this_mode_00;
  PREDICTION_MODE in_stack_ffffffffffffff77;
  undefined4 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff85;
  PREDICTION_MODE best_mode;
  undefined1 in_stack_ffffffffffffff86;
  int8_t ref_frame_type_00;
  undefined1 in_stack_ffffffffffffff87;
  PREDICTION_MODE this_mode_01;
  undefined2 in_stack_ffffffffffffff8c;
  PREDICTION_MODE in_stack_ffffffffffffff8e;
  undefined2 in_stack_ffffffffffffff94;
  char frame2;
  char frame1;
  AV1_COMP *cpi_00;
  undefined7 in_stack_ffffffffffffffa0;
  PREDICTION_MODE PVar6;
  undefined4 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  AV1_COMP *cpi_01;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar7;
  
  this_mode_00 = (PREDICTION_MODE)((uint)in_stack_ffffffffffffff70 >> 0x18);
  bVar1 = ""[in_R8D];
  PVar6 = av1_mode_defs[bVar1].mode;
  cpi_00 = (AV1_COMP *)av1_mode_defs[bVar1].ref_frame;
  frame1 = *(char *)cpi_00;
  frame2 = av1_mode_defs[bVar1].ref_frame[1];
  uVar3 = (uint)('\0' < frame2);
  if (frame1 == '\0') {
    iVar7 = 1;
  }
  else {
    cpi_01 = in_RDI;
    bsize_00 = get_frame_update_type(&in_RDI->ppi->gf_group,(uint)in_RDI->gf_frame_index);
    if ((((in_RDI->sf).inter_sf.skip_arf_compound == 0) || (bsize_00 != BLOCK_8X8)) || (uVar3 == 0))
    {
      if (((in_stack_00000008 == 0) || (uVar3 != 0)) || ((frame1 == '\x01' || (PVar6 == '\r')))) {
        iVar7 = inter_mode_compatible_skip
                          (cpi_00,(MACROBLOCK *)
                                  CONCAT17(frame1,CONCAT16(frame2,CONCAT24(in_stack_ffffffffffffff94
                                                                           ,uVar3))),bsize_00,
                           in_stack_ffffffffffffff8e,
                           (MV_REFERENCE_FRAME *)
                           CONCAT17(in_stack_ffffffffffffff87,
                                    CONCAT16(in_stack_ffffffffffffff86,
                                             CONCAT15(in_stack_ffffffffffffff85,
                                                      CONCAT14(in_stack_ffffffffffffff84,
                                                               in_stack_ffffffffffffff80)))));
        if (iVar7 == 0) {
          rf = av1_mode_defs[bVar1].ref_frame;
          iVar7 = inter_mode_search_order_independent_skip
                            ((AV1_COMP *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr
                             ,(mode_skip_mask_t *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (InterModeSearchState *)cpi_01,(int)((ulong)in_RSI >> 0x20),
                             (PREDICTION_MODE)((ulong)in_RSI >> 0x18),
                             (MV_REFERENCE_FRAME *)mode_threshold);
          if (iVar7 == 1) {
            iVar7 = 1;
          }
          else {
            *(uint *)*in_R9 = (uint)(iVar7 == 2);
            if ((((in_RDI->sf).interp_sf.skip_interp_filter_search == 0) &&
                (0 < (in_RDI->sf).inter_sf.prune_comp_search_by_single_result)) &&
               ((uVar3 != 0 && (*(int *)((long)in_R9 + 0x1c) == 0)))) {
              analyze_single_states(cpi_01,(InterModeSearchState *)in_R9[2]);
              *(undefined4 *)((long)in_R9 + 0x1c) = 1;
            }
            if (*(int *)(in_R9[2] + 0xd0) == 0) {
              iVar5 = 0x1000;
            }
            else {
              iVar5 = *(int *)(in_R9 + 4);
            }
            best_mode = (PREDICTION_MODE)((uint)iVar5 >> 8);
            ref_frame_type_00 = (int8_t)((uint)iVar5 >> 0x10);
            this_mode_01 = (PREDICTION_MODE)((uint)iVar5 >> 0x18);
            xd_00 = (MACROBLOCKD *)
                    (*(long *)(in_R9[2] + 0x140 + (ulong)bVar1 * 8) * (long)iVar5 >> 0xc);
            if (*(long *)in_R9[2] < (long)xd_00) {
              iVar7 = 1;
            }
            else if (((((in_RDI->sf).interp_sf.skip_interp_filter_search == 0) &&
                      (0 < (in_RDI->sf).inter_sf.prune_comp_search_by_single_result)) &&
                     (uVar3 != 0)) &&
                    (iVar4 = compound_skip_by_single_states
                                       (in_RSI,(InterModeSearchState *)
                                               CONCAT17(in_DL,in_stack_ffffffffffffffe0),
                                        (PREDICTION_MODE)((ulong)in_RCX >> 0x38),
                                        (MV_REFERENCE_FRAME)((ulong)in_RCX >> 0x30),
                                        (MV_REFERENCE_FRAME)((ulong)in_RCX >> 0x28),
                                        (MACROBLOCK *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0)),
                    iVar4 != 0)) {
              iVar7 = 1;
            }
            else {
              if (((in_RDI->sf).inter_sf.prune_compound_using_single_ref != 0) && (uVar3 != 0)) {
                if ((*(int *)(in_R9 + 5) == 0) && (*(int *)((long)in_R9 + 0x24) == 0x1c)) {
                  find_top_ref((int64_t *)CONCAT17(PVar6,in_stack_ffffffffffffffa0));
                  *(undefined4 *)(in_R9 + 5) = 1;
                }
                if ((*(int *)(in_R9 + 5) != 0) &&
                   (_Var2 = in_single_ref_cutoff(in_RCX,frame1,frame2), !_Var2)) {
                  return 1;
                }
              }
              if (((in_RDI->sf).inter_sf.skip_ext_comp_nearmv_mode == 0) ||
                 ((PVar6 != '\x16' && (PVar6 != '\x15')))) {
                if (((in_RDI->sf).inter_sf.prune_ext_comp_using_neighbors == 0) ||
                   ((uVar3 == 0 ||
                    (iVar4 = compound_skip_using_neighbor_refs
                                       (xd_00,in_stack_ffffffffffffff77,
                                        (MV_REFERENCE_FRAME *)
                                        CONCAT44(iVar5,in_stack_ffffffffffffff68),
                                        in_stack_ffffffffffffff64), iVar4 == 0)))) {
                  if (((in_RDI->sf).inter_sf.prune_comp_using_best_single_mode_ref == 0) ||
                     ((uVar3 == 0 ||
                      (iVar5 = skip_compound_using_best_single_mode_ref
                                         (this_mode_00,
                                          (MV_REFERENCE_FRAME *)
                                          CONCAT44(iVar5,in_stack_ffffffffffffff68),
                                          (PREDICTION_MODE *)
                                          CONCAT44(in_stack_ffffffffffffff64,
                                                   in_stack_ffffffffffffff60),
                                          (int)((ulong)rf >> 0x20)), iVar5 == 0)))) {
                    if (((in_RDI->sf).inter_sf.prune_nearest_near_mv_using_refmv_weight != 0) &&
                       (uVar3 == 0)) {
                      av1_ref_frame_type(rf);
                      iVar7 = skip_nearest_near_mv_using_refmv_weight
                                        ((MACROBLOCK *)
                                         CONCAT17(bsize_00,CONCAT16(in_stack_ffffffffffffff8e,
                                                                    CONCAT24(
                                                  in_stack_ffffffffffffff8c,iVar7))),this_mode_01,
                                         ref_frame_type_00,best_mode);
                      if (iVar7 != 0) {
                        return 1;
                      }
                    }
                    if ((((in_RDI->sf).rt_sf.prune_inter_modes_with_golden_ref != 0) &&
                        (frame1 == '\x04')) && (uVar3 == 0)) {
                      if ((cpi_01->ppi->gf_group).size < 0x10) {
                        iVar7 = (cpi_01->ppi->gf_group).size;
                      }
                      else {
                        iVar7 = 0x10;
                      }
                      if (((iVar7 >> 2 < (cpi_01->rc).frames_since_golden) &&
                          (*(char *)(in_R9[2] + 0x28) != '\x04')) &&
                         (((6 < in_DL && (PVar6 == '\x10')) || (PVar6 == '\x0e')))) {
                        return 1;
                      }
                    }
                    iVar7 = 0;
                  }
                  else {
                    iVar7 = 1;
                  }
                }
                else {
                  iVar7 = 1;
                }
              }
              else {
                iVar7 = 1;
              }
            }
          }
        }
        else {
          iVar7 = 1;
        }
      }
      else {
        iVar7 = 1;
      }
    }
    else {
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

static int skip_inter_mode(AV1_COMP *cpi, MACROBLOCK *x, const BLOCK_SIZE bsize,
                           int64_t *ref_frame_rd, int midx,
                           InterModeSFArgs *args, int is_low_temp_var) {
  const SPEED_FEATURES *const sf = &cpi->sf;
  MACROBLOCKD *const xd = &x->e_mbd;
  // Get the actual prediction mode we are trying in this iteration
  const THR_MODES mode_enum = av1_default_mode_order[midx];
  const MODE_DEFINITION *mode_def = &av1_mode_defs[mode_enum];
  const PREDICTION_MODE this_mode = mode_def->mode;
  const MV_REFERENCE_FRAME *ref_frames = mode_def->ref_frame;
  const MV_REFERENCE_FRAME ref_frame = ref_frames[0];
  const MV_REFERENCE_FRAME second_ref_frame = ref_frames[1];
  const int comp_pred = second_ref_frame > INTRA_FRAME;

  if (ref_frame == INTRA_FRAME) return 1;

  const FRAME_UPDATE_TYPE update_type =
      get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
  if (sf->inter_sf.skip_arf_compound && update_type == ARF_UPDATE &&
      comp_pred) {
    return 1;
  }

  // This is for real time encoding.
  if (is_low_temp_var && !comp_pred && ref_frame != LAST_FRAME &&
      this_mode != NEARESTMV)
    return 1;

  // Check if this mode should be skipped because it is incompatible with the
  // current frame
  if (inter_mode_compatible_skip(cpi, x, bsize, this_mode, ref_frames))
    return 1;
  const int ret = inter_mode_search_order_independent_skip(
      cpi, x, args->mode_skip_mask, args->search_state,
      args->skip_ref_frame_mask, this_mode, mode_def->ref_frame);
  if (ret == 1) return 1;
  *(args->skip_motion_mode) = (ret == 2);

  // We've reached the first compound prediction mode, get stats from the
  // single reference predictors to help with pruning.
  // Disable this pruning logic if interpolation filter search was skipped for
  // single prediction modes as it can result in aggressive pruning of compound
  // prediction modes due to the absence of modelled_rd populated by
  // av1_interpolation_filter_search().
  // TODO(Remya): Check the impact of the sf
  // 'prune_comp_search_by_single_result' if compound prediction modes are
  // enabled in future for REALTIME encode.
  if (!sf->interp_sf.skip_interp_filter_search &&
      sf->inter_sf.prune_comp_search_by_single_result > 0 && comp_pred &&
      args->reach_first_comp_mode == 0) {
    analyze_single_states(cpi, args->search_state);
    args->reach_first_comp_mode = 1;
  }

  // Prune aggressively when best mode is skippable.
  int mul_fact = args->search_state->best_mode_skippable
                     ? args->mode_thresh_mul_fact
                     : (1 << MODE_THRESH_QBITS);
  int64_t mode_threshold =
      (args->search_state->mode_threshold[mode_enum] * mul_fact) >>
      MODE_THRESH_QBITS;

  if (args->search_state->best_rd < mode_threshold) return 1;

  // Skip this compound mode based on the RD results from the single prediction
  // modes
  if (!sf->interp_sf.skip_interp_filter_search &&
      sf->inter_sf.prune_comp_search_by_single_result > 0 && comp_pred) {
    if (compound_skip_by_single_states(cpi, args->search_state, this_mode,
                                       ref_frame, second_ref_frame, x))
      return 1;
  }

  if (sf->inter_sf.prune_compound_using_single_ref && comp_pred) {
    // After we done with single reference modes, find the 2nd best RD
    // for a reference frame. Only search compound modes that have a reference
    // frame at least as good as the 2nd best.
    if (!args->prune_cpd_using_sr_stats_ready &&
        args->num_single_modes_processed == NUM_SINGLE_REF_MODES) {
      find_top_ref(ref_frame_rd);
      args->prune_cpd_using_sr_stats_ready = 1;
    }
    if (args->prune_cpd_using_sr_stats_ready &&
        !in_single_ref_cutoff(ref_frame_rd, ref_frame, second_ref_frame))
      return 1;
  }

  // Skip NEW_NEARMV and NEAR_NEWMV extended compound modes
  if (sf->inter_sf.skip_ext_comp_nearmv_mode &&
      (this_mode == NEW_NEARMV || this_mode == NEAR_NEWMV)) {
    return 1;
  }

  if (sf->inter_sf.prune_ext_comp_using_neighbors && comp_pred) {
    if (compound_skip_using_neighbor_refs(
            xd, this_mode, ref_frames,
            sf->inter_sf.prune_ext_comp_using_neighbors))
      return 1;
  }

  if (sf->inter_sf.prune_comp_using_best_single_mode_ref && comp_pred) {
    if (skip_compound_using_best_single_mode_ref(
            this_mode, ref_frames, args->search_state->best_single_mode,
            sf->inter_sf.prune_comp_using_best_single_mode_ref))
      return 1;
  }

  if (sf->inter_sf.prune_nearest_near_mv_using_refmv_weight && !comp_pred) {
    const int8_t ref_frame_type = av1_ref_frame_type(ref_frames);
    if (skip_nearest_near_mv_using_refmv_weight(
            x, this_mode, ref_frame_type,
            args->search_state->best_mbmode.mode)) {
      // Ensure the mode is pruned only when the current block has obtained a
      // valid inter mode.
      assert(is_inter_mode(args->search_state->best_mbmode.mode));
      return 1;
    }
  }

  if (sf->rt_sf.prune_inter_modes_with_golden_ref &&
      ref_frame == GOLDEN_FRAME && !comp_pred) {
    const int subgop_size = AOMMIN(cpi->ppi->gf_group.size, FIXED_GF_INTERVAL);
    if (cpi->rc.frames_since_golden > (subgop_size >> 2) &&
        args->search_state->best_mbmode.ref_frame[0] != GOLDEN_FRAME) {
      if ((bsize > BLOCK_16X16 && this_mode == NEWMV) || this_mode == NEARMV)
        return 1;
    }
  }

  return 0;
}